

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::SetEnumerable
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x7a8,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar2 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,&local_40);
  if (bVar2) {
    if ((local_40->Attributes & 0x10) == 0) {
      iVar4 = 1;
      if (value == 0) {
        ClearAttribute(this,instance,local_40,'\x01');
      }
      else {
        BVar3 = SetAttribute(this,instance,local_40,'\x01');
        if (BVar3 != 0) {
          DynamicObject::SetHasNoEnumerableProperties(instance,false);
        }
      }
    }
    else {
      iVar4 = 1;
    }
  }
  else {
    bVar2 = DynamicObject::HasObjectArray(instance);
    iVar4 = 1;
    if ((bVar2) && (*(char *)(descriptor + 4) == '\x01')) {
      pDVar6 = ConvertToTypeWithItemAttributes(this,instance);
      iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x29])
                        (pDVar6,instance,(ulong)(uint)propertyId,(ulong)(uint)value);
    }
  }
  return iVar4;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetEnumerable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (!propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(instance)
                    ->SetEnumerable(instance, propertyId, value);
            }
            return true;
        }

        if (descriptor->Attributes & PropertyLetConstGlobal)
        {
            return true;
        }

        if (value)
        {
            if (SetAttribute(instance, descriptor, PropertyEnumerable))
            {
                instance->SetHasNoEnumerableProperties(false);
            }
        }
        else
        {
            ClearAttribute(instance, descriptor, PropertyEnumerable);
        }
        return true;
    }